

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_determine_block_partition(MV block_mv,int block_mse,MV *subblock_mvs,int *subblock_mses)

{
  int local_38;
  int local_34;
  int i_1;
  int i;
  int64_t sum_subblock_mse;
  int max_subblock_mse;
  int min_subblock_mse;
  int *subblock_mses_local;
  MV *subblock_mvs_local;
  int block_mse_local;
  MV block_mv_local;
  
  min_subblock_mse = 0x7fffffff;
  max_subblock_mse = -0x80000000;
  sum_subblock_mse = 0;
  for (i = 0; i < 4; i = i + 1) {
    sum_subblock_mse = subblock_mses[i] + sum_subblock_mse;
    if (min_subblock_mse < subblock_mses[i]) {
      local_34 = min_subblock_mse;
    }
    else {
      local_34 = subblock_mses[i];
    }
    min_subblock_mse = local_34;
    if (subblock_mses[i] < max_subblock_mse) {
      local_38 = max_subblock_mse;
    }
    else {
      local_38 = subblock_mses[i];
    }
    max_subblock_mse = local_38;
  }
  if ((((long)(block_mse * 0xf) < sum_subblock_mse * 4) &&
      (max_subblock_mse - min_subblock_mse < 0x30)) ||
     (((long)(block_mse * 0xe) < sum_subblock_mse * 4 &&
      (max_subblock_mse - min_subblock_mse < 0x18)))) {
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      subblock_mvs[i_1] = block_mv;
      subblock_mses[i_1] = block_mse;
    }
  }
  return;
}

Assistant:

static void tf_determine_block_partition(const MV block_mv, const int block_mse,
                                         MV *subblock_mvs, int *subblock_mses) {
  int min_subblock_mse = INT_MAX;
  int max_subblock_mse = INT_MIN;
  int64_t sum_subblock_mse = 0;
  for (int i = 0; i < 4; ++i) {
    sum_subblock_mse += subblock_mses[i];
    min_subblock_mse = AOMMIN(min_subblock_mse, subblock_mses[i]);
    max_subblock_mse = AOMMAX(max_subblock_mse, subblock_mses[i]);
  }

  // TODO(any): The following magic numbers may be tuned to improve the
  // performance OR find a way to get rid of these magic numbers.
  if (((block_mse * 15 < sum_subblock_mse * 4) &&
       max_subblock_mse - min_subblock_mse < 48) ||
      ((block_mse * 14 < sum_subblock_mse * 4) &&
       max_subblock_mse - min_subblock_mse < 24)) {  // No split.
    for (int i = 0; i < 4; ++i) {
      subblock_mvs[i] = block_mv;
      subblock_mses[i] = block_mse;
    }
  }
}